

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-convert.cpp
# Opt level: O0

void test_convert<int,double>(uint length,int value)

{
  bool bVar1;
  int *__p;
  double *__p_00;
  element_type *pDst;
  element_type *pDst_00;
  undefined8 *puVar2;
  uint local_54;
  uint i;
  double *u;
  int *t;
  undefined1 local_30 [8];
  shared_ptr<double> pu;
  shared_ptr<int> pt;
  int value_local;
  uint length_local;
  
  __p = nosimd::common::malloc<int>(length);
  std::shared_ptr<int>::shared_ptr<int,void(*)(int*),void>
            ((shared_ptr<int> *)
             &pu.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount,__p,
             nosimd::common::free<int>);
  __p_00 = nosimd::common::malloc<double>(length);
  std::shared_ptr<double>::shared_ptr<double,void(*)(double*),void>
            ((shared_ptr<double> *)local_30,__p_00,nosimd::common::free<double>);
  pDst = std::__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>::get
                   ((__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2> *)
                    &pu.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pDst_00 = std::__shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>::get
                      ((__shared_ptr<double,_(__gnu_cxx::_Lock_policy)2> *)local_30);
  nosimd::common::set<int>(value,pDst,length);
  nosimd::common::convert<int,double>(pDst,pDst_00,length);
  local_54 = 0;
  while( true ) {
    if (length <= local_54) {
      std::shared_ptr<double>::~shared_ptr((shared_ptr<double> *)local_30);
      std::shared_ptr<int>::~shared_ptr
                ((shared_ptr<int> *)
                 &pu.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      return;
    }
    bVar1 = anon_unknown.dwarf_7f5d::equal<double>(pDst_00[local_54],(double)value);
    if (!bVar1) break;
    local_54 = local_54 + 1;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar2 = "void test_convert(unsigned int, _T) [_T = int, _U = double]";
  *(undefined4 *)(puVar2 + 1) = 0x17;
  *(uint *)((long)puVar2 + 0xc) = length;
  __cxa_throw(puVar2,&Exception::typeinfo,0);
}

Assistant:

void test_convert(unsigned length, _T value)
{
    auto pt = std::shared_ptr<_T>(simd::malloc<_T>(length), simd::free<_T>);
    auto pu = std::shared_ptr<_U>(simd::malloc<_U>(length), simd::free<_U>);
    _T * t = pt.get();
    _U * u = pu.get();

    simd::set(value, t, length);
    simd::convert(t, u, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(u[i], (_U)value))
            FAIL();
    }
}